

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,
          vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other)

{
  float *pfVar1;
  size_t sVar2;
  const_reference args;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  size_t i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffffd0;
  size_type sVar3;
  size_type local_20;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    clear(in_stack_ffffffffffffffd0);
    size(in_RSI);
    reserve(this_00,(size_t)in_RSI);
    local_20 = 0;
    while (sVar3 = local_20, sVar2 = size(in_RSI), sVar3 < sVar2) {
      pfVar1 = in_RDI->ptr;
      args = operator[](in_RSI,local_20);
      pmr::polymorphic_allocator<float>::construct<float,float_const&>
                (&in_RDI->alloc,pfVar1 + local_20,args);
      local_20 = local_20 + 1;
    }
    sVar2 = size(in_RSI);
    in_RDI->nStored = sVar2;
  }
  return in_RDI;
}

Assistant:

vector &operator=(const vector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();

        return *this;
    }